

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O3

bool benchmarkMany(uint32_t n,uint32_t m,uint32_t iterations,pospopcnt_u16_method_type fn,
                  bool verbose,bool test)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  uint16_t *puVar4;
  undefined1 (*pauVar5) [32];
  undefined1 auVar6 [16];
  bool bVar7;
  uint32_t uVar8;
  undefined4 uVar9;
  uint32_t uVar10;
  uint uVar11;
  result_type rVar12;
  pointer pvVar13;
  long lVar14;
  pointer pvVar15;
  ulong uVar16;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  bool bVar17;
  ulong uVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 in_ZMM3 [64];
  vector<int,_std::allocator<int>_> evts;
  vector<double,_std::allocator<double>_> avg;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> mins;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  vdata;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  allresults;
  uniform_int_distribution<int> dis;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> results;
  LinuxEvents<0> unified;
  random_device rd;
  mt19937 gen;
  vector<int,_std::allocator<int>_> local_2938;
  allocator_type local_2919;
  undefined1 local_2918 [16];
  pointer local_2908;
  uint32_t local_2900;
  uint local_28fc;
  ulong local_28f8;
  undefined4 local_28ec;
  uint32_t local_28e8;
  uint local_28e4;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_28e0;
  value_type local_28c8;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_28b0;
  undefined1 local_2898 [16];
  pointer local_2888;
  ulong local_2880;
  pospopcnt_u16_method_type local_2878;
  param_type local_2870;
  undefined1 local_2868 [16];
  pointer local_2858;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2848;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2830;
  vector<int,_std::allocator<int>_> local_2818;
  LinuxEvents<0> local_2800;
  anon_union_5000_2_650ea050_for_random_device_0 local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_28fc = iterations;
  local_2878 = fn;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_2740.field_0,(ulong)n
             ,(allocator_type *)&local_13b8);
  local_28f8 = (ulong)m;
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector(&local_28b0,(ulong)m,(value_type *)&local_2740.field_0,(allocator_type *)&local_2800);
  if ((void *)CONCAT44(local_2740._M_mt._M_x[0]._4_4_,local_2740._M_mt._M_x[0]._0_4_) != (void *)0x0
     ) {
    operator_delete((void *)CONCAT44(local_2740._M_mt._M_x[0]._4_4_,local_2740._M_mt._M_x[0]._0_4_))
    ;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 0;
  if (local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2938,
               (iterator)
               local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 1;
  if (local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2938,
               (iterator)
               local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 5;
  if (local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2938,
               (iterator)
               local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 5;
    local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 2;
  if (local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2938,
               (iterator)
               local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 3;
  if (local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2938,
               (iterator)
               local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 3;
    local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 9;
  if (local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2938,
               (iterator)
               local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 9;
    local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_2818,&local_2938);
  LinuxEvents<0>::LinuxEvents(&local_2800,&local_2818);
  if (local_2818.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2818.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_2888 = (pointer)0x0;
  local_2868 = (undefined1  [16])0x0;
  local_2858 = (pointer)0x0;
  local_2898 = (undefined1  [16])0x0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::resize
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_2868,
             (long)local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  std::random_device::random_device((random_device *)&local_2740.field_0);
  uVar11 = std::random_device::_M_getval();
  auVar24 = in_ZMM3._0_16_;
  lVar14 = 1;
  local_13b8._M_x[0] = (unsigned_long)uVar11;
  uVar18 = local_13b8._M_x[0];
  do {
    uVar18 = (ulong)(((uint)(uVar18 >> 0x1e) ^ (uint)uVar18) * 0x6c078965 + (int)lVar14);
    local_13b8._M_x[lVar14] = uVar18;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x270);
  local_28ec = (undefined4)CONCAT71(in_register_00000081,verbose);
  local_13b8._M_p = 0x270;
  local_2870._M_a = 0;
  local_2870._M_b = 0xffff;
  local_2900 = m;
  local_28e8 = n;
  if (local_28fc == 0) {
    bVar17 = true;
  }
  else {
    local_28e4 = (uint)CONCAT71(in_register_00000089,test) ^ 1;
    lVar14 = local_28f8 * 0x18;
    bVar17 = true;
    uVar18 = 0;
    do {
      auVar24 = in_ZMM3._0_16_;
      local_2880 = uVar18;
      if (local_28b0.
          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_28b0.
          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar18 = 0;
        pvVar13 = local_28b0.
                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pvVar15 = local_28b0.
                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (pvVar15[uVar18].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              pvVar15[uVar18].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            uVar16 = 0;
            do {
              rVar12 = std::uniform_int_distribution<int>::operator()
                                 ((uniform_int_distribution<int> *)&local_2870,&local_13b8,
                                  &local_2870);
              puVar3 = local_28b0.
                       super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar18].
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar3[uVar16] = (unsigned_short)rVar12;
              uVar16 = uVar16 + 1;
              pvVar13 = local_28b0.
                        super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pvVar15 = local_28b0.
                        super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar16 < (ulong)((long)local_28b0.
                                            super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar18].
                                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)puVar3 >> 1));
          }
          auVar24 = in_ZMM3._0_16_;
          uVar18 = uVar18 + 1;
        } while (uVar18 < (ulong)(((long)pvVar13 - (long)pvVar15 >> 3) * -0x5555555555555555));
      }
      local_2908 = (pointer)0x0;
      local_2918 = (undefined1  [16])0x0;
      local_2918._0_8_ = operator_new(0x40);
      local_2908 = (pointer)(local_2918._0_8_ + 0x40);
      auVar22 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
      *(undefined1 (*) [64])local_2918._0_8_ = auVar22;
      local_2918._8_8_ = local_2908;
      auVar22 = ZEXT1664(auVar24);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector(&local_28e0,local_28f8,(value_type *)local_2918,(allocator_type *)&local_28c8);
      uVar8 = local_2900;
      if ((pointer)local_2918._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_2918._0_8_);
      }
      uVar11 = local_28e4;
      auVar24 = auVar22._0_16_;
      if (uVar8 != 0) {
        lVar19 = 0;
        do {
          puVar4 = *(uint16_t **)
                    ((long)&((local_28b0.
                              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar19);
          pospopcnt_u16_scalar_naive
                    (puVar4,(uint32_t)
                            ((ulong)(*(long *)((long)&((local_28b0.
                                                                                                                
                                                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish +
                                              lVar19) - (long)puVar4) >> 1),
                     *(uint32_t **)
                      ((long)&((local_28e0.
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar19));
          auVar24 = auVar22._0_16_;
          lVar19 = lVar19 + 0x18;
        } while (lVar14 != lVar19);
      }
      local_28c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_28c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_28c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_28c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(0x40);
      local_28c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)local_28c8.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + 0x40);
      auVar22 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
      *(undefined1 (*) [64])
       local_28c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = auVar22;
      local_28c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_28c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      auVar22 = ZEXT1664(auVar24);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)local_2918,local_28f8,&local_28c8,&local_2919);
      if (local_28c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_28c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      LinuxEvents<0>::start(&local_2800);
      auVar24 = auVar22._0_16_;
      if (uVar8 != 0) {
        lVar19 = 0;
        do {
          puVar4 = *(uint16_t **)
                    ((long)&((local_28b0.
                              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar19);
          (*local_2878)(puVar4,(uint32_t)
                               ((ulong)(*(long *)((long)&((local_28b0.
                                                                                                                      
                                                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish +
                                                 lVar19) - (long)puVar4) >> 1),
                        *(uint32_t **)
                         ((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  local_2918._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                         lVar19));
          auVar24 = auVar22._0_16_;
          lVar19 = lVar19 + 0x18;
        } while (lVar14 != lVar19);
      }
      LinuxEvents<0>::end(&local_2800,
                          (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                          local_2868);
      if (uVar8 == 0) {
LAB_00111a28:
        bVar7 = false;
      }
      else {
        lVar19 = 0;
        uVar18 = 0;
        do {
          pauVar5 = *(undefined1 (**) [32])
                     ((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                              local_2918._0_8_)->_M_impl).super__Vector_impl_data._M_start + lVar19)
          ;
          lVar19 = lVar19 + 0x18;
          auVar22 = vpmovzxdq_avx512f(*pauVar5);
          auVar23 = vpmovzxdq_avx512f(pauVar5[1]);
          auVar22 = vpaddq_avx512f(ZEXT864(uVar18),auVar22);
          auVar22 = vpaddq_avx512f(auVar22,auVar23);
          auVar21 = vextracti64x4_avx512f(auVar22,1);
          auVar22 = vpaddq_avx512f(auVar22,ZEXT3264(auVar21));
          auVar6 = vpaddq_avx(auVar22._0_16_,auVar22._16_16_);
          auVar20 = vpshufd_avx(auVar6,0xee);
          auVar6 = vpaddq_avx(auVar6,auVar20);
          uVar18 = auVar6._0_8_;
        } while (lVar14 != lVar19);
        if (uVar18 == 0) goto LAB_00111a28;
        if (uVar8 != 0) {
          uVar18 = 0;
          do {
            lVar19 = 0;
            do {
              uVar1 = local_28e0.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar18].
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar19];
              uVar2 = (((pointer)(local_2918._0_8_ + uVar18 * 0x18))->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar19];
              if (uVar1 != uVar2 && (char)uVar11 == '\0') {
                puts("bug:");
                bVar7 = false;
                printf("expected : ");
                print16(local_28e0.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar18].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
                printf("got      : ");
                print16((((pointer)(local_2918._0_8_ + uVar18 * 0x18))->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start);
                goto LAB_00111a7c;
              }
              lVar19 = lVar19 + 1;
              bVar17 = (bool)(bVar17 & uVar1 == uVar2);
            } while (lVar19 != 0x10);
            uVar18 = uVar18 + 1;
          } while (uVar18 != local_28f8);
        }
        bVar7 = true;
        std::
        vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
        ::push_back((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                     *)local_2898,(value_type *)local_2868);
      }
LAB_00111a7c:
      in_ZMM3 = ZEXT1664(auVar24);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)local_2918);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_28e0);
      auVar24 = in_ZMM3._0_16_;
      if (!bVar7) {
        bVar17 = false;
        goto LAB_00111c10;
      }
      uVar11 = (int)local_2880 + 1;
      uVar18 = (ulong)uVar11;
    } while (uVar11 != local_28fc);
  }
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::vector(&local_2830,
           (vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)local_2898);
  compute_mins((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)&local_28e0,
               &local_2830);
  uVar10 = local_28e8;
  uVar9 = local_28ec;
  uVar8 = local_2900;
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector(&local_2830);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::vector(&local_2848,
           (vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)local_2898);
  compute_averages((vector<double,_std::allocator<double>_> *)local_2918,&local_2848);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector(&local_2848);
  if ((char)uVar9 == '\0') {
    auVar20 = vcvtusi2sd_avx512f(auVar24,((local_28e0.
                                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_start);
    auVar6 = vcvtusi2sd_avx512f(auVar24,uVar8 * uVar10);
    auVar24 = vcvtusi2sd_avx512f(auVar24,local_28e0.
                                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[1].
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    printf("cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n",
           auVar20._0_8_ / auVar6._0_8_,auVar24._0_8_ / auVar6._0_8_);
  }
  else {
    auVar6._0_8_ = ((local_28e0.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
    auVar6._8_8_ = ((local_28e0.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
    auVar20 = vcvtuqq2pd_avx512vl(auVar6);
    auVar6 = vshufpd_avx(auVar20,auVar20,1);
    auVar24 = vcvtusi2sd_avx512f(auVar24,uVar8 * uVar10);
    printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, instructions per 16-bit word %4.3f \n"
           ,auVar6._0_8_ / auVar20._0_8_,auVar20._0_8_ / auVar24._0_8_,auVar6._0_8_ / auVar24._0_8_)
    ;
    printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu cache ref., %8llu cache mis.\n"
           ,((local_28e0.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start,
           ((local_28e0.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish,
           ((local_28e0.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage,
           local_28e0.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start,
           local_28e0.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish);
    printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f cache ref., %8.1f cache mis.\n"
           ,(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_2918._0_8_)->
            _M_impl).super__Vector_impl_data._M_start,
           (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_2918._0_8_)->_M_impl
           ).super__Vector_impl_data._M_finish,
           (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_2918._0_8_)->_M_impl
           ).super__Vector_impl_data._M_end_of_storage,
           (((pointer)(local_2918._0_8_ + 0x18))->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start,
           (((pointer)(local_2918._0_8_ + 0x18))->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish);
  }
  if ((pointer)local_2918._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2918._0_8_);
  }
  if (local_28e0.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28e0.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_00111c10:
  std::random_device::_M_fini();
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             *)local_2898);
  if ((pointer)local_2868._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2868._0_8_);
  }
  LinuxEvents<0>::~LinuxEvents(&local_2800);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_28b0);
  if (local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2938.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar17;
}

Assistant:

bool benchmarkMany(uint32_t n, uint32_t m, uint32_t iterations, pospopcnt_u16_method_type fn, bool verbose, bool test) {
    std::vector<int> evts;
    std::vector<std::vector<uint16_t>> vdata(m, std::vector<uint16_t>(n));
    evts.push_back(PERF_COUNT_HW_CPU_CYCLES);
    evts.push_back(PERF_COUNT_HW_INSTRUCTIONS);
    evts.push_back(PERF_COUNT_HW_BRANCH_MISSES);
    evts.push_back(PERF_COUNT_HW_CACHE_REFERENCES);
    evts.push_back(PERF_COUNT_HW_CACHE_MISSES);
    evts.push_back(PERF_COUNT_HW_REF_CPU_CYCLES);
    LinuxEvents<PERF_TYPE_HARDWARE> unified(evts);
    std::vector<unsigned long long> results; // tmp buffer
    std::vector< std::vector<unsigned long long> > allresults;
    results.resize(evts.size());
    
    std::random_device rd;
    std::mt19937 gen(rd());
    std::uniform_int_distribution<> dis(0, 0xFFFF);

    bool isok = true;
    for (uint32_t i = 0; i < iterations; i++) {
        for (size_t k = 0; k < vdata.size(); k++) {
            for(size_t k2 = 0; k2 < vdata[k].size() ; k2++) { 
               vdata[k][k2] = dis(gen); // random init.
            }
        }
        std::vector<std::vector<uint32_t>> correctflags(m,std::vector<uint32_t>(16));
        for (size_t k = 0; k < m; k++) {
          pospopcnt_u16_scalar_naive(vdata[k].data(), vdata[k].size(), correctflags[k].data()); // this is our gold standard
        }
        std::vector<std::vector<uint32_t>> flags(m,std::vector<uint32_t>(16));
        
        unified.start();
        for (size_t k = 0; k < m ; k++) {
          fn(vdata[k].data(), vdata[k].size(), flags[k].data());
        }
        unified.end(results);

        uint64_t tot_obs = 0;
        for (size_t km = 0; km < m; ++km)
          for (size_t k = 0; k < 16; ++k) tot_obs += flags[km][k];
        if (tot_obs == 0) { // when a method is not supported it returns all zero
            return false;
        }
        for (size_t km = 0; km < m; ++km) {
          for (size_t k = 0; k < 16; k++) {
            if (correctflags[km][k] != flags[km][k]) {
                if (test) {
                    printf("bug:\n");
                    printf("expected : ");
                    print16(correctflags[km].data());
                    printf("got      : ");
                    print16(flags[km].data());
                    return false;
                } else {
                    isok = false;
                }
            }
          }
        }
        allresults.push_back(results);
    }

    std::vector<unsigned long long> mins = compute_mins(allresults);
    std::vector<double> avg = compute_averages(allresults);
    
    if (verbose) {
        printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, "
               "instructions per 16-bit word %4.3f \n",
                double(mins[1]) / mins[0], double(mins[0]) / (n*m), double(mins[1]) / (n*m));
        // first we display mins
        printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu "
               "cache ref., %8llu cache mis.\n",
                mins[0], mins[1], mins[2], mins[3], mins[4]);
        printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f "
               "cache ref., %8.1f cache mis.\n",
                avg[0], avg[1], avg[2], avg[3], avg[4]);
    } else {
        printf("cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n", double(mins[0]) / (n*m), double(mins[5]) / (n*m));
    }

    return isok;
}